

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# eimgfs.cpp
# Opt level: O2

void __thiscall ImgfsFile::imgfsheader::imgfsheader(imgfsheader *this,ReadWriter_ptr *rd)

{
  uint uVar1;
  uint uVar2;
  element_type *peVar3;
  ulong uVar4;
  ulong uVar5;
  uint32_t uVar6;
  undefined8 *puVar7;
  string local_50;
  
  peVar3 = (rd->super___shared_ptr<ReadWriter,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  (*peVar3->_vptr_ReadWriter[4])(peVar3,0x1c);
  uVar6 = ReadWriter::read32le
                    ((rd->super___shared_ptr<ReadWriter,_(__gnu_cxx::_Lock_policy)2>)._M_ptr);
  this->direntsize = uVar6;
  uVar6 = ReadWriter::read32le
                    ((rd->super___shared_ptr<ReadWriter,_(__gnu_cxx::_Lock_policy)2>)._M_ptr);
  this->chunksperblock = uVar6;
  uVar6 = ReadWriter::read32le
                    ((rd->super___shared_ptr<ReadWriter,_(__gnu_cxx::_Lock_policy)2>)._M_ptr);
  this->bytesperblock = uVar6;
  ReadWriter::read32le((rd->super___shared_ptr<ReadWriter,_(__gnu_cxx::_Lock_policy)2>)._M_ptr);
  uVar6 = ReadWriter::read32le
                    ((rd->super___shared_ptr<ReadWriter,_(__gnu_cxx::_Lock_policy)2>)._M_ptr);
  this->compressiontype = uVar6;
  uVar6 = ReadWriter::read32le
                    ((rd->super___shared_ptr<ReadWriter,_(__gnu_cxx::_Lock_policy)2>)._M_ptr);
  this->freesectorcount = uVar6;
  uVar6 = ReadWriter::read32le
                    ((rd->super___shared_ptr<ReadWriter,_(__gnu_cxx::_Lock_policy)2>)._M_ptr);
  this->hiddensectorcount = uVar6;
  uVar1 = this->bytesperblock;
  uVar2 = this->chunksperblock;
  uVar4 = (ulong)uVar1 / (ulong)uVar2;
  this->bytesperchunk = (uint32_t)uVar4;
  uVar5 = (ulong)(uVar1 - 8) / (ulong)this->direntsize;
  this->entriesperblock = (uint32_t)uVar5;
  if (this->direntsize == 0x34) {
    if (g_verbose != 0) {
      getstr<unsigned_char_const*>(&local_50,(uchar *)&this->compressiontype,4);
      printf("imgfshdr: dirent=%d, cpb=%d, bpb=%d bpc=%d, epb= %d, comp=%s free=%d, hidden=%d\n",
             0x34,(ulong)uVar2,(ulong)uVar1,uVar4,uVar5,local_50._M_dataplus._M_p,
             (ulong)this->freesectorcount,(ulong)this->hiddensectorcount);
      std::__cxx11::string::~string((string *)&local_50);
    }
    return;
  }
  puVar7 = (undefined8 *)__cxa_allocate_exception(8);
  *puVar7 = "unsupported direntsize";
  __cxa_throw(puVar7,&char_const*::typeinfo,0);
}

Assistant:

imgfsheader(ReadWriter_ptr rd)
        {
            // 00: f8 ac 2c 9d e3 d4 2b 4d bd 30 91 6e d8 4f 31 dc

            // 0x10 : 1
            // 0x14 : 1
            // 0x18 : 1
            rd->setpos(0x1c);
            direntsize= rd->read32le(); // 0x1c : 0x34
            chunksperblock= rd->read32le(); // 0x20 : 0x20
            bytesperblock= rd->read32le(); // 0x24 : 0x800
            rd->read32le(); // 0x28 : 0x1000
            compressiontype= rd->read32le(); // 0x2c
            freesectorcount= rd->read32le(); // 0x30
            hiddensectorcount= rd->read32le(); // 0x34 : 0x40

            bytesperchunk= bytesperblock/chunksperblock;
            entriesperblock= (bytesperblock-8)/direntsize;
            if (direntsize!=0x34)
                throw "unsupported direntsize";

            if (g_verbose) { 
                printf("imgfshdr: dirent=%d, cpb=%d, bpb=%d bpc=%d, epb= %d, comp=%s free=%d, hidden=%d\n", 
                    direntsize, chunksperblock, bytesperblock, bytesperchunk, entriesperblock, getstr((const uint8_t*)&compressiontype, 4).c_str(), freesectorcount, hiddensectorcount);
            }
        }